

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<double,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  long lVar1;
  ulong *puVar2;
  double *Xc_00;
  long *plVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  size_t *key;
  ulong *key_00;
  ulong *puVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar17;
  longdouble in_ST3;
  longdouble lVar18;
  longdouble lVar19;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar20;
  tuple<> local_129;
  longdouble local_128;
  longdouble local_11c;
  longdouble local_110;
  longdouble local_104;
  longdouble local_f8;
  longdouble local_ec;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_e0;
  longdouble local_d4;
  ulong local_c8;
  long local_c0;
  size_t *local_b8;
  longdouble local_b0;
  size_t local_a0;
  size_t local_98;
  longdouble local_8c;
  size_t local_80;
  long local_78;
  size_t *local_70;
  long local_68;
  ushort uStack_60;
  long local_58;
  ushort uStack_50;
  double local_38;
  
  local_b0 = (longdouble)CONCAT28(local_b0._8_2_,Xc);
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    return -INFINITY;
  }
  local_128 = (longdouble)CONCAT28(local_128._8_2_,Xc_ind);
  lVar14 = (longdouble)0;
  local_b8 = ix_arr;
  local_a0 = st;
  local_80 = col_num;
  plVar3 = Xc_ind;
  if (st <= end) {
    key = ix_arr + st;
    lVar14 = (longdouble)0;
    do {
      local_f8 = lVar14;
      local_e0._M_head_impl = key;
      pVar20 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::
               insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_unsigned_long_&> *)&local_e0,&local_129);
      lVar14 = local_f8 + (longdouble)*(double *)((pVar20.first.m_bucket.m_bucket)->m_value + 8);
      st = st + 1;
      key = key + 1;
      plVar3 = local_128._0_8_;
    } while (st <= end);
  }
  local_128._0_8_ = plVar3;
  plVar3 = local_128._0_8_;
  if (lVar14 <= (longdouble)0) {
    return -INFINITY;
  }
  lVar9 = Xc_indptr[local_80];
  lVar1 = Xc_indptr[local_80 + 1];
  key_00 = local_b8 + local_a0;
  puVar13 = local_b8 + end + 1;
  uVar5 = (long)puVar13 - (long)key_00 >> 3;
  if (0 < (long)uVar5) {
    do {
      uVar6 = uVar5 >> 1;
      uVar10 = ~uVar6 + uVar5;
      uVar5 = uVar6;
      if (key_00[uVar6] < (ulong)local_128._0_8_[lVar9]) {
        key_00 = key_00 + uVar6 + 1;
        uVar5 = uVar10;
      }
    } while (0 < (long)uVar5);
  }
  local_78 = lVar1 + -1;
  uVar5 = local_128._0_8_[lVar1 + -1];
  local_70 = local_b8 + end;
  local_f8 = lVar14;
  local_c8 = uVar5;
  local_c0 = lVar1;
  local_98 = end;
  if (missing_action == Fail) {
    local_128 = (longdouble)0;
    lVar16 = local_128;
    local_11c = local_128;
    local_ec = local_128;
    if (lVar9 != lVar1 && key_00 != puVar13) {
      local_128 = (longdouble)0;
      lVar12 = lVar1;
      lVar16 = local_128;
      lVar15 = in_ST3;
      local_11c = local_128;
      local_ec = local_128;
      while( true ) {
        uVar6 = *key_00;
        if (uVar5 < uVar6) break;
        puVar8 = (ulong *)(plVar3 + lVar9);
        uVar10 = *puVar8;
        if (uVar10 == uVar6) {
          local_e0._M_head_impl = key_00;
          local_d4 = lVar16;
          pVar20 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_e0,&local_129);
          local_110 = (longdouble)*(double *)((pVar20.first.m_bucket.m_bucket)->m_value + 8);
          local_8c = (longdouble)*(double *)((long)local_b0._0_8_ + lVar9 * 8);
          local_104 = local_8c * local_8c;
          lVar16 = in_ST3;
          lVar17 = lVar15;
          lVar18 = lVar15;
          in_ST3 = lVar15;
          fmal();
          local_11c = in_ST0;
          fmal();
          lVar19 = in_ST3;
          local_128 = in_ST1;
          fmal();
          local_ec = in_ST2;
          fmal();
          lVar14 = local_f8;
          if ((key_00 == local_70) || (lVar9 == local_78)) break;
          puVar8 = puVar8 + 1;
          key_00 = key_00 + 1;
          uVar5 = (long)plVar3 + (lVar1 * 8 - (long)puVar8) >> 3;
          if (0 < (long)uVar5) {
            do {
              uVar6 = uVar5 >> 1;
              uVar10 = ~uVar6 + uVar5;
              uVar5 = uVar6;
              if ((puVar8 + uVar6 + 1)[-1] < *key_00) {
                puVar8 = puVar8 + uVar6 + 1;
                uVar5 = uVar10;
              }
            } while (0 < (long)uVar5);
          }
          lVar9 = (long)puVar8 - (long)plVar3 >> 3;
          lVar12 = local_c0;
          uVar5 = local_c8;
          in_ST0 = lVar15;
          in_ST1 = lVar17;
          in_ST2 = lVar18;
          lVar15 = lVar19;
        }
        else if ((long)uVar6 < (long)uVar10) {
          key_00 = key_00 + 1;
          uVar6 = (long)puVar13 - (long)key_00 >> 3;
          while (0 < (long)uVar6) {
            uVar7 = uVar6 >> 1;
            uVar11 = ~uVar7 + uVar6;
            uVar6 = uVar7;
            if (key_00[uVar7] < uVar10) {
              key_00 = key_00 + uVar7 + 1;
              uVar6 = uVar11;
            }
          }
        }
        else {
          puVar2 = puVar8 + 1;
          uVar10 = (long)plVar3 + (lVar1 * 8 - (long)(puVar8 + 1)) >> 3;
          while (0 < (long)uVar10) {
            uVar7 = uVar10 >> 1;
            uVar11 = ~uVar7 + uVar10;
            uVar10 = uVar7;
            if ((puVar2 + uVar7 + 1)[-1] < uVar6) {
              puVar2 = puVar2 + uVar7 + 1;
              uVar10 = uVar11;
            }
          }
          lVar9 = (long)puVar2 - (long)plVar3 >> 3;
        }
        if ((key_00 == puVar13) || (lVar9 == lVar12)) break;
      }
    }
  }
  else {
    local_d4 = (longdouble)0;
    local_128 = local_d4;
    local_11c = local_d4;
    local_ec = local_d4;
    if (lVar9 != lVar1 && key_00 != puVar13) {
      local_d4 = (longdouble)0;
      lVar12 = lVar1;
      local_128 = local_d4;
      lVar16 = in_ST3;
      local_11c = local_d4;
      local_ec = local_d4;
      while( true ) {
        uVar6 = *key_00;
        lVar14 = local_f8;
        if (uVar5 < uVar6) break;
        puVar8 = (ulong *)(plVar3 + lVar9);
        uVar10 = *puVar8;
        if (uVar10 == uVar6) {
          local_e0._M_head_impl = key_00;
          pVar20 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_e0,&local_129);
          lVar14 = (longdouble)*(double *)((pVar20.first.m_bucket.m_bucket)->m_value + 8);
          local_38 = *(double *)((long)local_b0._0_8_ + lVar9 * 8);
          lVar15 = (longdouble)local_38;
          local_58 = SUB108(lVar15,0);
          uStack_50 = (ushort)((unkuint10)lVar15 >> 0x40);
          if ((NAN(local_38)) || ((~uStack_50 & 0x7fff) == 0 && local_58 == -0x8000000000000000)) {
            local_f8 = local_f8 - lVar14;
          }
          else {
            local_104 = lVar15 * lVar15;
            lVar17 = lVar16;
            lVar18 = lVar16;
            lVar19 = lVar16;
            local_110 = lVar14;
            local_8c = lVar15;
            fmal();
            local_11c = in_ST0;
            fmal();
            in_ST0 = lVar16;
            lVar16 = lVar19;
            local_128 = in_ST1;
            fmal();
            local_ec = in_ST2;
            fmal();
            local_d4 = in_ST3;
            in_ST1 = lVar17;
            in_ST2 = lVar18;
            in_ST3 = lVar19;
          }
          lVar14 = local_f8;
          if ((key_00 == local_70) || (lVar9 == local_78)) break;
          puVar8 = puVar8 + 1;
          key_00 = key_00 + 1;
          uVar5 = (long)plVar3 + (lVar1 * 8 - (long)puVar8) >> 3;
          if (0 < (long)uVar5) {
            do {
              uVar6 = uVar5 >> 1;
              uVar10 = ~uVar6 + uVar5;
              uVar5 = uVar6;
              if ((puVar8 + uVar6 + 1)[-1] < *key_00) {
                puVar8 = puVar8 + uVar6 + 1;
                uVar5 = uVar10;
              }
            } while (0 < (long)uVar5);
          }
          lVar9 = (long)puVar8 - (long)plVar3 >> 3;
          lVar12 = local_c0;
          uVar5 = local_c8;
        }
        else if ((long)uVar6 < (long)uVar10) {
          key_00 = key_00 + 1;
          uVar6 = (long)puVar13 - (long)key_00 >> 3;
          while (0 < (long)uVar6) {
            uVar7 = uVar6 >> 1;
            uVar11 = ~uVar7 + uVar6;
            uVar6 = uVar7;
            if (key_00[uVar7] < uVar10) {
              key_00 = key_00 + uVar7 + 1;
              uVar6 = uVar11;
            }
          }
        }
        else {
          puVar2 = puVar8 + 1;
          uVar10 = (long)plVar3 + (lVar1 * 8 - (long)(puVar8 + 1)) >> 3;
          while (0 < (long)uVar10) {
            uVar7 = uVar10 >> 1;
            uVar11 = ~uVar7 + uVar10;
            uVar10 = uVar7;
            if ((puVar2 + uVar7 + 1)[-1] < uVar6) {
              puVar2 = puVar2 + uVar7 + 1;
              uVar10 = uVar11;
            }
          }
          lVar9 = (long)puVar2 - (long)plVar3 >> 3;
        }
        lVar14 = local_f8;
        if ((key_00 == puVar13) || (lVar9 == lVar12)) break;
      }
    }
    lVar16 = local_d4;
    if (lVar14 <= (longdouble)0) {
      return -INFINITY;
    }
  }
  Xc_00 = local_b0._0_8_;
  if ((longdouble)1 < lVar14) {
    if ((local_128 != (longdouble)0) || (NAN(local_128) || NAN((longdouble)0))) {
      if ((local_128 != local_11c * local_11c) || (NAN(local_128) || NAN(local_11c * local_11c))) {
        local_110 = local_11c / lVar14;
        local_104 = local_110 * local_110;
        local_b0 = local_128 / lVar14 - local_104;
        if ((!NAN(local_b0)) &&
           ((local_f8 = lVar14, local_d4 = lVar16, (longdouble)2.220446e-16 < local_b0 ||
            (bVar4 = check_more_than_two_unique_values<double,long>
                               (local_b8,local_a0,local_98,local_80,Xc_indptr,plVar3,Xc_00,
                                missing_action), bVar4)))) {
          if (local_b0 <= (longdouble)0) {
            return 0.0;
          }
          lVar14 = (local_104 * local_110 * local_110 * local_f8 +
                   local_11c * (longdouble)-4.0 * local_104 * local_110 +
                   local_128 * (longdouble)6.0 * local_104 +
                   local_d4 + local_ec * (longdouble)-4.0 * local_110) /
                   (local_b0 * local_b0 * local_f8);
          local_68 = SUB108(lVar14,0);
          uStack_60 = (ushort)((unkuint10)lVar14 >> 0x40);
          if (((unkuint10)lVar14 & 0x7fff) == 0 ||
              (ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe && local_68 < 0) {
            if ((double)lVar14 <= 0.0) {
              return 0.0;
            }
            return (double)lVar14;
          }
          return -INFINITY;
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}